

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gbabus.c
# Opt level: O1

void gba_write_word_cold_14(void)

{
  fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
          "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c",0x25f);
  fprintf(_stderr,"UNIMPLEMENTED CASE DETECTED: %s\n\x1b[0;m",
          "Trying to get the address of a wrong-sized word ioreg");
  exit(1);
}

Assistant:

INLINE word* get_word_ioreg_ptr(word addr) {
    unimplemented(get_ioreg_size_for_addr(addr) != sizeof(word), "Trying to get the address of a wrong-sized word ioreg")
    switch (addr & 0xFFF) {
        case IO_BG2X:     return &ppu->BG2X.initial.raw;
        case IO_BG2Y:     return &ppu->BG2Y.initial.raw;
        case IO_BG3X:     return &ppu->BG3X.initial.raw;
        case IO_BG3Y:     return &ppu->BG3Y.initial.raw;
        case IO_DMA0SAD:  return &bus->DMA0SAD.raw;
        case IO_DMA0DAD:  return &bus->DMA0DAD.raw;
        case IO_DMA1SAD:  return &bus->DMA1SAD.raw;
        case IO_DMA1DAD:  return &bus->DMA1DAD.raw;
        case IO_DMA2SAD:  return &bus->DMA2SAD.raw;
        case IO_DMA2DAD:  return &bus->DMA2DAD.raw;
        case IO_DMA3SAD:  return &bus->DMA3SAD.raw;
        case IO_DMA3DAD:  return &bus->DMA3DAD.raw;
        case IO_FIFO_A:
        case IO_FIFO_B:
        case IO_JOY_RECV:
        case IO_JOY_TRANS:
        case IO_IMEM_CTRL:
            return NULL;
        default: logfatal("Tried to get the address of an unknown (but valid) word ioreg addr: 0x%08X", addr)
    }
}